

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugLine::LineTable::dump(LineTable *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  pointer pRVar1;
  raw_ostream *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  char *pcVar2;
  Row *R;
  pointer this_01;
  
  Prologue::dump(&this->Prologue,OS,DumpOptions);
  pcVar2 = OS->OutBufCur;
  if (pcVar2 < OS->OutBufEnd) {
    OS->OutBufCur = pcVar2 + 1;
    *pcVar2 = '\n';
  }
  else {
    raw_ostream::write(OS,10,__buf,in_RCX);
  }
  if ((this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __n = (long)OS->OutBufEnd - (long)OS->OutBufCur;
    if (__n < 0x40) {
      this_00 = (raw_ostream *)raw_ostream::write(OS,0xbca675,(void *)0x40,__n);
      pcVar2 = this_00->OutBufCur;
    }
    else {
      builtin_strncpy(OS->OutBufCur,
                      "Address            Line   Column File   ISA Discriminator Flags\n",0x40);
      pcVar2 = OS->OutBufCur + 0x40;
      OS->OutBufCur = pcVar2;
      this_00 = OS;
    }
    if ((ulong)((long)this_00->OutBufEnd - (long)pcVar2) < 0x48) {
      raw_ostream::write(this_00,0xbca6b6,&DAT_00000048,__n);
    }
    else {
      memcpy(pcVar2,"------------------ ------ ------ ------ --- ------------- -------------\n",0x48
            );
      this_00->OutBufCur = this_00->OutBufCur + 0x48;
    }
    pRVar1 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (this->Rows).
                   super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != pRVar1;
        this_01 = this_01 + 1) {
      Row::dump(this_01,OS);
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::LineTable::dump(raw_ostream &OS,
                                     DIDumpOptions DumpOptions) const {
  Prologue.dump(OS, DumpOptions);
  OS << '\n';

  if (!Rows.empty()) {
    Row::dumpTableHeader(OS);
    for (const Row &R : Rows) {
      R.dump(OS);
    }
  }
}